

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.h
# Opt level: O3

string * __thiscall
pstack::stringify<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
          (string *__return_storage_ptr__,pstack *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *things,
          char (*things_1) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *things_2)

{
  ostream *poVar1;
  size_t sVar2;
  ostringstream local_1a8 [8];
  ostringstream stream;
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,*(char **)this,*(long *)(this + 8));
  sVar2 = strlen((char *)things);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)things,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,*(char **)things_1,*(long *)(things_1 + 4));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string
stringify(Stuff&&... things)
{
    std::ostringstream stream;
    ( stream <<  ... << things );
    return stream.str();
}